

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.c
# Opt level: O0

void ecatcheck(void *ptr)

{
  int iVar1;
  uint local_14;
  int slave;
  void *ptr_local;
  
  do {
    if ((inOP != '\0') &&
       ((wkc < expectedWKC || ((&DAT_001060d2)[(ulong)currentgroup * 0x138] != '\0')))) {
      if (needlf != '\0') {
        needlf = '\0';
        printf("\n");
      }
      (&DAT_001060d2)[(ulong)currentgroup * 0x138] = 0;
      ec_readstate();
      for (local_14 = 1; (int)local_14 <= _ec_slavecount; local_14 = local_14 + 1) {
        if ((*(uint8 *)((long)(int)local_14 * 0x148 + 0x1061b3) == currentgroup) &&
           (*(short *)(&ec_slave + (long)(int)local_14 * 0x148) != 8)) {
          (&DAT_001060d2)[(ulong)currentgroup * 0x138] = 1;
          if (*(short *)(&ec_slave + (long)(int)local_14 * 0x148) == 0x14) {
            printf("ERROR : slave %d is in SAFE_OP + ERROR, attempting ack.\n",(ulong)local_14);
            *(undefined2 *)(&ec_slave + (long)(int)local_14 * 0x148) = 0x14;
            ec_writestate(local_14 & 0xffff);
          }
          else if (*(short *)(&ec_slave + (long)(int)local_14 * 0x148) == 4) {
            printf("WARNING : slave %d is in SAFE_OP, change to OPERATIONAL.\n",(ulong)local_14);
            *(undefined2 *)(&ec_slave + (long)(int)local_14 * 0x148) = 8;
            ec_writestate(local_14 & 0xffff);
          }
          else if (*(short *)(&ec_slave + (long)(int)local_14 * 0x148) == 0) {
            if ((*(char *)((long)(int)local_14 * 0x148 + 0x1061b5) == '\0') &&
               (ec_statecheck(local_14 & 0xffff,8,2000),
               *(short *)(&ec_slave + (long)(int)local_14 * 0x148) == 0)) {
              *(undefined1 *)((long)(int)local_14 * 0x148 + 0x1061b5) = 1;
              printf("ERROR : slave %d lost\n",(ulong)local_14);
            }
          }
          else {
            iVar1 = ec_reconfig_slave(local_14 & 0xffff,500);
            if (iVar1 != 0) {
              *(undefined1 *)((long)(int)local_14 * 0x148 + 0x1061b5) = 0;
              printf("MESSAGE : slave %d reconfigured\n",(ulong)local_14);
            }
          }
        }
        if (*(char *)((long)(int)local_14 * 0x148 + 0x1061b5) != '\0') {
          if (*(short *)(&ec_slave + (long)(int)local_14 * 0x148) == 0) {
            iVar1 = ec_recover_slave(local_14 & 0xffff,500);
            if (iVar1 != 0) {
              *(undefined1 *)((long)(int)local_14 * 0x148 + 0x1061b5) = 0;
              printf("MESSAGE : slave %d recovered\n",(ulong)local_14);
            }
          }
          else {
            *(undefined1 *)((long)(int)local_14 * 0x148 + 0x1061b5) = 0;
            printf("MESSAGE : slave %d found\n",(ulong)local_14);
          }
        }
      }
      if ((&DAT_001060d2)[(ulong)currentgroup * 0x138] == '\0') {
        printf("OK : all slaves resumed OPERATIONAL.\n");
      }
    }
    usleep(10000);
  } while( true );
}

Assistant:

void ecatcheck( void *ptr )
{
    int slave;

    while(1)
    {
        if( inOP && ((wkc < expectedWKC) || ec_group[currentgroup].docheckstate))
        {
            if (needlf)
            {
               needlf = FALSE;
               printf("\n");
            }
            /* one ore more slaves are not responding */
            ec_group[currentgroup].docheckstate = FALSE;
            ec_readstate();
            for (slave = 1; slave <= ec_slavecount; slave++)
            {
               if ((ec_slave[slave].group == currentgroup) && (ec_slave[slave].state != EC_STATE_OPERATIONAL))
               {
                  ec_group[currentgroup].docheckstate = TRUE;
                  if (ec_slave[slave].state == (EC_STATE_SAFE_OP + EC_STATE_ERROR))
                  {
                     printf("ERROR : slave %d is in SAFE_OP + ERROR, attempting ack.\n", slave);
                     ec_slave[slave].state = (EC_STATE_SAFE_OP + EC_STATE_ACK);
                     ec_writestate(slave);
                  }
                  else if(ec_slave[slave].state == EC_STATE_SAFE_OP)
                  {
                     printf("WARNING : slave %d is in SAFE_OP, change to OPERATIONAL.\n", slave);
                     ec_slave[slave].state = EC_STATE_OPERATIONAL;
                     ec_writestate(slave);                              
                  }
                  else if(ec_slave[slave].state > 0)
                  {
                     if (ec_reconfig_slave(slave, EC_TIMEOUTMON))
                     {
                        ec_slave[slave].islost = FALSE;
                        printf("MESSAGE : slave %d reconfigured\n",slave);                           
                     }
                  } 
                  else if(!ec_slave[slave].islost)
                  {
                     /* re-check state */
                     ec_statecheck(slave, EC_STATE_OPERATIONAL, EC_TIMEOUTRET);
                     if (!ec_slave[slave].state)
                     {
                        ec_slave[slave].islost = TRUE;
                        printf("ERROR : slave %d lost\n",slave);                           
                     }
                  }
               }
               if (ec_slave[slave].islost)
               {
                  if(!ec_slave[slave].state)
                  {
                     if (ec_recover_slave(slave, EC_TIMEOUTMON))
                     {
                        ec_slave[slave].islost = FALSE;
                        printf("MESSAGE : slave %d recovered\n",slave);                           
                     }
                  }
                  else
                  {
                     ec_slave[slave].islost = FALSE;
                     printf("MESSAGE : slave %d found\n",slave);                           
                  }
               }
            }
            if(!ec_group[currentgroup].docheckstate)
               printf("OK : all slaves resumed OPERATIONAL.\n");
        }
        usleep(10000);
    }   
}